

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall clipp::parameter::add_flags(parameter *this,arg_string *str)

{
  ulong uVar1;
  arg_string *str_local;
  parameter *this_local;
  
  clipp::str::remove_ws<char,std::char_traits<char>,std::allocator<char>>(str);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->flags_,str);
  }
  return;
}

Assistant:

void add_flags(arg_string str) {
        //empty flags are not allowed
        str::remove_ws(str);
        if(!str.empty()) flags_.push_back(std::move(str));
    }